

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_gen_key(mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
                       void *p_rng,uint nbits,int exponent)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_98 [8];
  mbedtls_mpi G;
  mbedtls_mpi H;
  mbedtls_mpi Q1;
  mbedtls_mpi P1;
  int ret;
  int exponent_local;
  uint nbits_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  if (((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) || (nbits < 0x80)) || (exponent < 3)) {
    ctx_local._4_4_ = -0x4080;
  }
  else if ((nbits & 1) == 0) {
    mbedtls_mpi_init((mbedtls_mpi *)&Q1.p);
    mbedtls_mpi_init((mbedtls_mpi *)&H.p);
    mbedtls_mpi_init((mbedtls_mpi *)&G.p);
    mbedtls_mpi_init((mbedtls_mpi *)local_98);
    P1.p._4_4_ = mbedtls_mpi_lset(&ctx->E,(long)exponent);
    if (P1.p._4_4_ == 0) {
      do {
        P1.p._4_4_ = mbedtls_mpi_gen_prime(&ctx->P,(ulong)(nbits >> 1),0,f_rng,p_rng);
        if ((P1.p._4_4_ != 0) ||
           (P1.p._4_4_ = mbedtls_mpi_gen_prime(&ctx->Q,(ulong)(nbits >> 1),0,f_rng,p_rng),
           P1.p._4_4_ != 0)) goto LAB_0010e049;
        iVar1 = mbedtls_mpi_cmp_mpi(&ctx->P,&ctx->Q);
        if (iVar1 != 0) {
          P1.p._4_4_ = mbedtls_mpi_mul_mpi(&ctx->N,&ctx->P,&ctx->Q);
          if (P1.p._4_4_ != 0) goto LAB_0010e049;
          sVar2 = mbedtls_mpi_bitlen(&ctx->N);
          if (sVar2 == nbits) {
            iVar1 = mbedtls_mpi_cmp_mpi(&ctx->P,&ctx->Q);
            if (iVar1 < 0) {
              mbedtls_mpi_swap(&ctx->P,&ctx->Q);
            }
            P1.p._4_4_ = mbedtls_mpi_sub_int((mbedtls_mpi *)&Q1.p,&ctx->P,1);
            if (((P1.p._4_4_ != 0) ||
                (P1.p._4_4_ = mbedtls_mpi_sub_int((mbedtls_mpi *)&H.p,&ctx->Q,1), P1.p._4_4_ != 0))
               || ((P1.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&G.p,(mbedtls_mpi *)&Q1.p,
                                                     (mbedtls_mpi *)&H.p), P1.p._4_4_ != 0 ||
                   (P1.p._4_4_ = mbedtls_mpi_gcd((mbedtls_mpi *)local_98,&ctx->E,(mbedtls_mpi *)&G.p
                                                ), P1.p._4_4_ != 0)))) goto LAB_0010e049;
          }
        }
        iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)local_98,1);
      } while (iVar1 != 0);
      P1.p._4_4_ = mbedtls_mpi_inv_mod(&ctx->D,&ctx->E,(mbedtls_mpi *)&G.p);
      if ((((P1.p._4_4_ == 0) &&
           (P1.p._4_4_ = mbedtls_mpi_mod_mpi(&ctx->DP,&ctx->D,(mbedtls_mpi *)&Q1.p), P1.p._4_4_ == 0
           )) && (P1.p._4_4_ = mbedtls_mpi_mod_mpi(&ctx->DQ,&ctx->D,(mbedtls_mpi *)&H.p),
                 P1.p._4_4_ == 0)) &&
         (P1.p._4_4_ = mbedtls_mpi_inv_mod(&ctx->QP,&ctx->Q,&ctx->P), P1.p._4_4_ == 0)) {
        sVar2 = mbedtls_mpi_bitlen(&ctx->N);
        ctx->len = sVar2 + 7 >> 3;
      }
    }
LAB_0010e049:
    mbedtls_mpi_free((mbedtls_mpi *)&Q1.p);
    mbedtls_mpi_free((mbedtls_mpi *)&H.p);
    mbedtls_mpi_free((mbedtls_mpi *)&G.p);
    mbedtls_mpi_free((mbedtls_mpi *)local_98);
    if (P1.p._4_4_ == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      mbedtls_rsa_free(ctx);
      ctx_local._4_4_ = P1.p._4_4_ + -0x4180;
    }
  }
  else {
    ctx_local._4_4_ = -0x4080;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_gen_key( mbedtls_rsa_context *ctx,
                 int (*f_rng)(void *, unsigned char *, size_t),
                 void *p_rng,
                 unsigned int nbits, int exponent )
{
    int ret;
    mbedtls_mpi P1, Q1, H, G;

    if( f_rng == NULL || nbits < 128 || exponent < 3 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    if( nbits % 2 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    mbedtls_mpi_init( &P1 ); mbedtls_mpi_init( &Q1 );
    mbedtls_mpi_init( &H ); mbedtls_mpi_init( &G );

    /*
     * find primes P and Q with Q < P so that:
     * GCD( E, (P-1)*(Q-1) ) == 1
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &ctx->E, exponent ) );

    do
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_gen_prime( &ctx->P, nbits >> 1, 0,
                                f_rng, p_rng ) );

        MBEDTLS_MPI_CHK( mbedtls_mpi_gen_prime( &ctx->Q, nbits >> 1, 0,
                                f_rng, p_rng ) );

        if( mbedtls_mpi_cmp_mpi( &ctx->P, &ctx->Q ) == 0 )
            continue;

        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ctx->N, &ctx->P, &ctx->Q ) );
        if( mbedtls_mpi_bitlen( &ctx->N ) != nbits )
            continue;

        if( mbedtls_mpi_cmp_mpi( &ctx->P, &ctx->Q ) < 0 )
                                mbedtls_mpi_swap( &ctx->P, &ctx->Q );

        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &P1, &ctx->P, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &Q1, &ctx->Q, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &H, &P1, &Q1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &G, &ctx->E, &H  ) );
    }
    while( mbedtls_mpi_cmp_int( &G, 1 ) != 0 );

    /*
     * D  = E^-1 mod ((P-1)*(Q-1))
     * DP = D mod (P - 1)
     * DQ = D mod (Q - 1)
     * QP = Q^-1 mod P
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &ctx->D , &ctx->E, &H  ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &ctx->DP, &ctx->D, &P1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &ctx->DQ, &ctx->D, &Q1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &ctx->QP, &ctx->Q, &ctx->P ) );

    ctx->len = ( mbedtls_mpi_bitlen( &ctx->N ) + 7 ) >> 3;

cleanup:

    mbedtls_mpi_free( &P1 ); mbedtls_mpi_free( &Q1 ); mbedtls_mpi_free( &H ); mbedtls_mpi_free( &G );

    if( ret != 0 )
    {
        mbedtls_rsa_free( ctx );
        return( MBEDTLS_ERR_RSA_KEY_GEN_FAILED + ret );
    }

    return( 0 );
}